

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void reindexTable(Parse *pParse,Table *pTab,char *zColl)

{
  byte bVar1;
  uint uVar2;
  Index *pIndex;
  ulong uVar3;
  Schema **ppSVar4;
  byte *pbVar5;
  byte *pbVar6;
  Parse *pPVar7;
  
  pIndex = pTab->pIndex;
  do {
    if (pIndex == (Index *)0x0) {
      return;
    }
    if (zColl == (char *)0x0) {
LAB_0019ff24:
      if (pTab->pSchema == (Schema *)0x0) {
        uVar3 = 0xfff0bdc0;
      }
      else {
        uVar2 = pParse->db->nDb;
        if ((int)uVar2 < 1) {
          uVar3 = 0;
        }
        else {
          ppSVar4 = &pParse->db->aDb->pSchema;
          uVar3 = 0;
          do {
            if (*ppSVar4 == pTab->pSchema) goto LAB_0019ff67;
            uVar3 = uVar3 + 1;
            ppSVar4 = ppSVar4 + 4;
          } while (uVar2 != uVar3);
          uVar3 = (ulong)uVar2;
        }
      }
LAB_0019ff67:
      pPVar7 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar7 = pParse;
      }
      sqlite3CodeVerifySchema(pParse,(int)uVar3);
      pPVar7->writeMask = pPVar7->writeMask | 1 << ((byte)uVar3 & 0x1f);
      sqlite3RefillIndex(pParse,pIndex,-1);
    }
    else if ((ulong)pIndex->nColumn != 0) {
      uVar3 = 0;
      do {
        pbVar6 = (byte *)pIndex->azColl[uVar3];
        bVar1 = *pbVar6;
        pbVar5 = (byte *)zColl;
        while ((bVar1 != 0 && (pbVar6 = pbVar6 + 1, ""[bVar1] == ""[*pbVar5]))) {
          pbVar5 = pbVar5 + 1;
          bVar1 = *pbVar6;
        }
        if (""[bVar1] == ""[*pbVar5]) goto LAB_0019ff24;
        uVar3 = uVar3 + 1;
      } while (uVar3 != pIndex->nColumn);
    }
    pIndex = pIndex->pNext;
  } while( true );
}

Assistant:

static void reindexTable(Parse *pParse, Table *pTab, char const *zColl){
  Index *pIndex;              /* An index associated with pTab */

  for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
    if( zColl==0 || collationMatch(zColl, pIndex) ){
      int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
      sqlite3BeginWriteOperation(pParse, 0, iDb);
      sqlite3RefillIndex(pParse, pIndex, -1);
    }
  }
}